

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall
ncnn::NetPrivate::convert_layout(NetPrivate *this,Mat *bottom_blob,Layer *layer,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  Mat local_78;
  
  if ((opt->use_bf16_storage == true) && (iVar3 = bottom_blob->elempack, iVar3 != 0)) {
    if ((((int)bottom_blob->elemsize << 3) / iVar3 == 0x20) && (layer->support_bf16_storage == true)
       ) {
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      cast_float32_to_bfloat16(bottom_blob,&local_78,opt);
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (&local_78 != bottom_blob) {
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = bottom_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (bottom_blob->allocator == (Allocator *)0x0) {
              if (bottom_blob->data != (void *)0x0) {
                free(bottom_blob->data);
              }
            }
            else {
              (*bottom_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        bottom_blob->data = local_78.data;
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        bottom_blob->refcount = piVar4;
        bottom_blob->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
        bottom_blob->elempack = local_78.elempack;
        bottom_blob->allocator = local_78.allocator;
        bottom_blob->dims = local_78.dims;
        bottom_blob->w = local_78.w;
        bottom_blob->h = local_78.h;
        bottom_blob->d = local_78.d;
        bottom_blob->c = local_78.c;
        bottom_blob->cstep = local_78.cstep;
      }
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar3 = bottom_blob->elempack;
      if (iVar3 == 0) goto LAB_0016a8b1;
    }
    if ((((int)bottom_blob->elemsize << 3) / iVar3 == 0x10) &&
       (layer->support_bf16_storage == false)) {
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      cast_bfloat16_to_float32(bottom_blob,&local_78,opt);
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (&local_78 != bottom_blob) {
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = bottom_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (bottom_blob->allocator == (Allocator *)0x0) {
              if (bottom_blob->data != (void *)0x0) {
                free(bottom_blob->data);
              }
            }
            else {
              (*bottom_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        bottom_blob->data = local_78.data;
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        bottom_blob->refcount = piVar4;
        bottom_blob->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
        bottom_blob->elempack = local_78.elempack;
        bottom_blob->allocator = local_78.allocator;
        bottom_blob->dims = local_78.dims;
        bottom_blob->w = local_78.w;
        bottom_blob->h = local_78.h;
        bottom_blob->d = local_78.d;
        bottom_blob->c = local_78.c;
        bottom_blob->cstep = local_78.cstep;
      }
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
LAB_0016a8b1:
  if (opt->use_packing_layout != true) {
    return 0;
  }
  iVar3 = bottom_blob->elempack;
  iVar6 = bottom_blob->dims;
  iVar2 = 0;
  uVar5 = bottom_blob->w * iVar3;
  if (iVar6 != 1) {
    uVar5 = 0;
  }
  uVar1 = bottom_blob->h * iVar3;
  if (iVar6 != 2) {
    uVar1 = uVar5;
  }
  uVar5 = bottom_blob->c * iVar3;
  if (iVar6 != 3) {
    uVar5 = uVar1;
  }
  iVar6 = 1;
  if (iVar3 == 0) {
    if (layer->support_packing == false) goto LAB_0016a969;
LAB_0016a935:
    iVar3 = 4;
    if ((uVar5 & 3) != 0 || iVar2 != 0x10) {
      iVar3 = iVar6;
    }
    iVar6 = 8;
    if ((uVar5 & 7) != 0 || iVar2 != 8) {
      iVar6 = iVar3;
    }
    iVar3 = bottom_blob->elempack;
  }
  else if (layer->support_packing != false) {
    iVar2 = ((int)bottom_blob->elemsize << 3) / iVar3;
    if (iVar2 == 0x20) {
      if ((uVar5 & 7) == 0) {
        iVar3 = cpu_support_x86_avx2();
        iVar6 = 8;
        iVar2 = 0x20;
        if ((iVar3 != 0) || (iVar3 = cpu_support_x86_avx(), iVar3 != 0)) goto LAB_0016a935;
      }
      iVar6 = (uint)((uVar5 & 3) == 0) * 3 + 1;
      iVar2 = 0x20;
    }
    goto LAB_0016a935;
  }
  if (iVar3 == iVar6) {
    return 0;
  }
LAB_0016a969:
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  convert_packing(bottom_blob,&local_78,iVar6,opt);
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (&local_78 != bottom_blob) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (bottom_blob->allocator == (Allocator *)0x0) {
          if (bottom_blob->data != (void *)0x0) {
            free(bottom_blob->data);
          }
        }
        else {
          (*bottom_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    bottom_blob->data = local_78.data;
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    bottom_blob->refcount = piVar4;
    bottom_blob->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
    bottom_blob->elempack = local_78.elempack;
    bottom_blob->allocator = local_78.allocator;
    bottom_blob->dims = local_78.dims;
    bottom_blob->w = local_78.w;
    bottom_blob->h = local_78.h;
    bottom_blob->d = local_78.d;
    bottom_blob->c = local_78.c;
    bottom_blob->cstep = local_78.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int NetPrivate::convert_layout(Mat& bottom_blob, const Layer* layer, const Option& opt) const
{
    // clang-format off
    // *INDENT-OFF*
#if NCNN_ARM82
    if (opt.use_fp16_storage && cpu_support_arm_asimdhp())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_ARM82
#if NCNN_RVV
    if (opt.use_fp16_storage && cpu_support_riscv_v() && cpu_support_riscv_zfh())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_RVV
#if NCNN_BF16
    if (opt.use_bf16_storage)
    {
        if (bottom_blob.elembits() == 32 && layer->support_bf16_storage)
        {
            Mat bottom_blob_bf16;
            cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
            bottom_blob = bottom_blob_bf16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_bf16_storage)
        {
            Mat bottom_blob_fp32;
            cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_BF16
    {
        // no type conversion
    }
    // *INDENT-ON*
    // clang-format on

    if (opt.use_packing_layout)
    {
        // resolve dst_elempack
        int dims = bottom_blob.dims;
        int elemcount = 0;
        if (dims == 1) elemcount = bottom_blob.elempack * bottom_blob.w;
        if (dims == 2) elemcount = bottom_blob.elempack * bottom_blob.h;
        if (dims == 3) elemcount = bottom_blob.elempack * bottom_blob.c;

        int elembits = bottom_blob.elembits();

        int dst_elempack = 1;
        if (layer->support_packing)
        {
            if (elembits == 32)
            {
#if (NCNN_AVX2 || NCNN_AVX)
                if (elemcount % 8 == 0 && (ncnn::cpu_support_x86_avx2() || ncnn::cpu_support_x86_avx()))
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 4;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 16)
            {
#if NCNN_ARM82
                if (elemcount % 8 == 0 && opt.use_fp16_storage && opt.use_fp16_arithmetic && layer->support_fp16_storage)
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 2;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 8)
            {
#if NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 1;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 8 == 0)
                    dst_elempack = 8;
#endif
            }
        }

        if (bottom_blob.elempack != dst_elempack)
        {
            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, dst_elempack, opt);
            bottom_blob = bottom_blob_packed;
        }
    }

    return 0;
}